

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableExpression.cpp
# Opt level: O3

void __thiscall
Kandinsky::VariableExpression::fillVariableSet
          (VariableExpression *this,
          set<Kandinsky::Variable,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
          *variableSet,BaseExpressionPtr *thisSharedPtr)

{
  element_type *peVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  element_type *peVar3;
  Variable local_38;
  
  peVar1 = (thisSharedPtr->super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    local_38.m_variableExpressionPtr.
    super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    peVar3 = (element_type *)__dynamic_cast(peVar1,&BaseExpression::typeinfo,&typeinfo,0);
    local_38.m_variableExpressionPtr.
    super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if ((peVar3 != (element_type *)0x0) &&
       (local_38.m_variableExpressionPtr.
        super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (thisSharedPtr->
                super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi,
       local_38.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3
       , local_38.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_00108b10;
        LOCK();
        (local_38.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
LAB_00108b10:
        (local_38.m_variableExpressionPtr.
         super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.m_variableExpressionPtr.
              super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
      bVar2 = false;
      goto LAB_00108b15;
    }
  }
  local_38.m_variableExpressionPtr.
  super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = true;
LAB_00108b15:
  this_00._M_pi =
       local_38.m_variableExpressionPtr.
       super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  local_38._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
  std::
  _Rb_tree<Kandinsky::Variable,_Kandinsky::Variable,_std::_Identity<Kandinsky::Variable>,_Kandinsky::VariableLessThanComparator,_std::allocator<Kandinsky::Variable>_>
  ::_M_insert_unique<Kandinsky::Variable>(&variableSet->_M_t,&local_38);
  local_38._vptr_Variable = (_func_int **)&PTR_differentiate_0010ccb0;
  if (local_38.m_variableExpressionPtr.
      super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.m_variableExpressionPtr.
               super___shared_ptr<Kandinsky::VariableExpression,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (!bVar2) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void VariableExpression::fillVariableSet(std::set<Variable, VariableLessThanComparator>& variableSet, const BaseExpressionPtr& thisSharedPtr) const
    {
        variableSet.insert(Variable(std::dynamic_pointer_cast<VariableExpression>(thisSharedPtr)));
    }